

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyDescriptor.cpp
# Opt level: O0

void __thiscall
Js::PropertyDescriptor::MergeFrom(PropertyDescriptor *this,PropertyDescriptor *descriptor)

{
  void **ppvVar1;
  PropertyDescriptor *descriptor_local;
  PropertyDescriptor *this_local;
  
  if ((descriptor->configurableSpecified & 1U) != 0) {
    SetConfigurable(this,(bool)(descriptor->Configurable & 1));
  }
  if ((descriptor->enumerableSpecified & 1U) != 0) {
    SetEnumerable(this,(bool)(descriptor->Enumerable & 1));
  }
  if ((descriptor->writableSpecified & 1U) != 0) {
    SetWritable(this,(bool)(descriptor->Writable & 1));
  }
  if ((descriptor->valueSpecified & 1U) != 0) {
    ppvVar1 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)descriptor);
    SetValue(this,*ppvVar1);
  }
  if ((descriptor->getterSpecified & 1U) != 0) {
    ppvVar1 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)&descriptor->Getter);
    SetGetter(this,*ppvVar1);
  }
  if ((descriptor->setterSpecified & 1U) != 0) {
    ppvVar1 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)&descriptor->Setter);
    SetSetter(this,*ppvVar1);
  }
  return;
}

Assistant:

void PropertyDescriptor::MergeFrom(const PropertyDescriptor& descriptor)
    {
        if (descriptor.configurableSpecified)
        {
            this->SetConfigurable(descriptor.Configurable);
        }
        if (descriptor.enumerableSpecified)
        {
            this->SetEnumerable(descriptor.Enumerable);
        }
        if (descriptor.writableSpecified)
        {
            this->SetWritable(descriptor.Writable);
        }

        if (descriptor.valueSpecified)
        {
            this->SetValue(descriptor.Value);
        }
        if (descriptor.getterSpecified)
        {
            this->SetGetter(descriptor.Getter);
        }
        if (descriptor.setterSpecified)
        {
            this->SetSetter(descriptor.Setter);
        }
    }